

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  __type _Var1;
  ulong uVar2;
  char *pcVar3;
  string *in_RSI;
  long in_RDI;
  string local_name;
  string local_pname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe78;
  Option *in_stack_fffffffffffffe80;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [32];
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  uVar2 = ::std::__cxx11::string::length();
  if (((uVar2 < 3) ||
      (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_18), *pcVar3 != '-')) ||
     (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_18), *pcVar3 != '-')) {
    uVar2 = ::std::__cxx11::string::length();
    if ((uVar2 < 2) || (pcVar3 = (char *)::std::__cxx11::string::front(), *pcVar3 != '-')) {
      uVar2 = ::std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ::std::__cxx11::string::string(local_88,(string *)(in_RDI + 0x88));
        ::std::__cxx11::string::string(local_a8,local_18);
        if ((*(byte *)(in_RDI + 0x22) & 1) != 0) {
          ::std::__cxx11::string::string(local_e8,local_88);
          detail::remove_underscore(in_stack_fffffffffffffe68);
          ::std::__cxx11::string::operator=(local_88,local_c8);
          ::std::__cxx11::string::~string(local_c8);
          ::std::__cxx11::string::~string(local_e8);
          ::std::__cxx11::string::string(local_128,local_a8);
          detail::remove_underscore(in_stack_fffffffffffffe68);
          ::std::__cxx11::string::operator=(local_a8,local_108);
          ::std::__cxx11::string::~string(local_108);
          ::std::__cxx11::string::~string(local_128);
        }
        if ((*(byte *)(in_RDI + 0x21) & 1) != 0) {
          ::std::__cxx11::string::string(local_168,local_88);
          detail::to_lower(in_stack_fffffffffffffe58);
          ::std::__cxx11::string::operator=(local_88,local_148);
          ::std::__cxx11::string::~string(local_148);
          ::std::__cxx11::string::~string(local_168);
          ::std::__cxx11::string::string((string *)&stack0xfffffffffffffe58,local_a8);
          detail::to_lower(in_stack_fffffffffffffe58);
          ::std::__cxx11::string::operator=(local_a8,(string *)&stack0xfffffffffffffe78);
          ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
          ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
        }
        _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                                  in_stack_fffffffffffffe38);
        if (_Var1) {
          local_1 = 1;
        }
        ::std::__cxx11::string::~string(local_a8);
        ::std::__cxx11::string::~string(local_88);
        if (_Var1) goto LAB_001502c0;
      }
      uVar2 = ::std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40)
                                    ,in_stack_fffffffffffffe38);
      }
      else {
        local_1 = 0;
      }
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_68,(ulong)local_18);
      local_1 = check_sname(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      ::std::__cxx11::string::~string(local_68);
    }
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_38,(ulong)local_18);
    local_1 = check_lname(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string(local_38);
  }
LAB_001502c0:
  return (bool)(local_1 & 1);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool Option::check_name(const std::string &name) const {

    if(name.length() > 2 && name[0] == '-' && name[1] == '-')
        return check_lname(name.substr(2));
    if(name.length() > 1 && name.front() == '-')
        return check_sname(name.substr(1));
    if(!pname_.empty()) {
        std::string local_pname = pname_;
        std::string local_name = name;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            local_name = detail::remove_underscore(local_name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            local_name = detail::to_lower(local_name);
        }
        if(local_name == local_pname) {
            return true;
        }
    }

    if(!envname_.empty()) {
        // this needs to be the original since envname_ shouldn't match on case insensitivity
        return (name == envname_);
    }
    return false;
}